

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Fad<double> *pFVar4;
  FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_> *pFVar5;
  double *pdVar6;
  FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  value_type vVar12;
  double dVar13;
  
  uVar1 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar11 = (long)(int)uVar2 << 3;
      }
      pdVar10 = (double *)operator_new__(uVar11);
      (this->dx_).ptr_to_data = pdVar10;
    }
  }
  if (uVar2 != 0) {
    pdVar10 = (this->dx_).ptr_to_data;
    pFVar4 = (fadexpr->fadexpr_).left_;
    if (((pFVar4->dx_).num_elts == 0) ||
       ((((((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)
       ) {
      if (0 < (int)uVar2) {
        uVar11 = 0;
        do {
          vVar12 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>
                   ::dx(&fadexpr->fadexpr_,(int)uVar11);
          pdVar10[uVar11] = vVar12;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
    }
    else if (0 < (int)uVar2) {
      pFVar5 = (fadexpr->fadexpr_).right_;
      iVar3 = (pFVar5->fadexpr_).left_.constant_;
      pdVar6 = (pFVar4->dx_).ptr_to_data;
      pFVar7 = (pFVar5->fadexpr_).right_;
      dVar13 = (double)(pFVar7->fadexpr_).left_.constant_;
      pFVar8 = (pFVar7->fadexpr_).right_;
      pdVar9 = (pFVar8->dx_).ptr_to_data;
      uVar11 = 0;
      do {
        pdVar10[uVar11] =
             (pFVar8->val_ * dVar13 + (double)iVar3) * pdVar6[uVar11] +
             pdVar9[uVar11] * dVar13 * pFVar4->val_;
        uVar11 = uVar11 + 1;
      } while (uVar2 != uVar11);
    }
  }
  pFVar5 = (fadexpr->fadexpr_).right_;
  pFVar7 = (pFVar5->fadexpr_).right_;
  this->val_ = ((double)(pFVar7->fadexpr_).left_.constant_ * ((pFVar7->fadexpr_).right_)->val_ +
               (double)(pFVar5->fadexpr_).left_.constant_) * ((fadexpr->fadexpr_).left_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}